

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O2

void telnet_size(Backend *be,int width,int height)

{
  BackendVtable *pBVar1;
  uint uVar2;
  Interactor *pIVar3;
  ulong uVar4;
  ulong uVar5;
  uchar b [24];
  
  *(int *)&be[-8].interactor = width;
  *(int *)((long)&be[-8].interactor + 4) = height;
  pBVar1 = be[-10].vt;
  if ((pBVar1 != (BackendVtable *)0x0) && (*(int *)&be[-7].interactor == 1)) {
    b[0] = 0xff;
    b[1] = 0xfa;
    b[2] = '\x1f';
    b[3] = (uchar)((uint)width >> 8);
    if ((~width & 0xff00U) == 0) {
      b[4] = 0xff;
      uVar2 = 5;
    }
    else {
      uVar2 = 4;
    }
    uVar4 = (ulong)uVar2;
    b[uVar4] = (uchar)width;
    uVar5 = uVar4 + 1;
    if ((uchar)width == 0xff) {
      b[uVar4 + 1] = 0xff;
      uVar5 = (ulong)(uVar2 | 2);
    }
    b[uVar5] = (uchar)((uint)height >> 8);
    uVar4 = uVar5 + 1;
    if ((~height & 0xff00U) == 0) {
      b[uVar5 + 1] = 0xff;
      uVar4 = (ulong)((int)uVar5 + 2);
    }
    b[uVar4] = (uchar)height;
    uVar5 = uVar4 + 1;
    if ((uchar)height == 0xff) {
      b[uVar4 + 1] = 0xff;
      uVar5 = (ulong)((int)uVar4 + 2);
    }
    (b + uVar5)[0] = 0xff;
    (b + uVar5)[1] = 0xf0;
    pIVar3 = (Interactor *)(**(code **)(pBVar1->init + 0x10))(pBVar1,b,(int)uVar5 + 2);
    be[-4].interactor = pIVar3;
    logeventf((LogContext *)be[-9].interactor,"client subnegotiation: SB NAWS %d,%d",
              (ulong)*(uint *)&be[-8].interactor,(ulong)*(uint *)((long)&be[-8].interactor + 4));
  }
  return;
}

Assistant:

static void telnet_size(Backend *be, int width, int height)
{
    Telnet *telnet = container_of(be, Telnet, backend);
    unsigned char b[24];
    int n;

    telnet->term_width = width;
    telnet->term_height = height;

    if (telnet->s == NULL || telnet->opt_states[o_naws.index] != ACTIVE)
        return;
    n = 0;
    b[n++] = IAC;
    b[n++] = SB;
    b[n++] = TELOPT_NAWS;
    b[n++] = telnet->term_width >> 8;
    if (b[n-1] == IAC) b[n++] = IAC;   /* duplicate any IAC byte occurs */
    b[n++] = telnet->term_width & 0xFF;
    if (b[n-1] == IAC) b[n++] = IAC;   /* duplicate any IAC byte occurs */
    b[n++] = telnet->term_height >> 8;
    if (b[n-1] == IAC) b[n++] = IAC;   /* duplicate any IAC byte occurs */
    b[n++] = telnet->term_height & 0xFF;
    if (b[n-1] == IAC) b[n++] = IAC;   /* duplicate any IAC byte occurs */
    b[n++] = IAC;
    b[n++] = SE;
    telnet->bufsize = sk_write(telnet->s, b, n);
    logeventf(telnet->logctx, "client subnegotiation: SB NAWS %d,%d",
              telnet->term_width, telnet->term_height);
}